

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

_Bool run_timers(unsigned_long anow,unsigned_long *next)

{
  undefined8 *ptr;
  void *pvVar1;
  
  init_timers();
  now = getticks();
  do {
    ptr = (undefined8 *)index234(timers,0);
    if (ptr == (undefined8 *)0x0) {
LAB_0010662e:
      return ptr != (undefined8 *)0x0;
    }
    pvVar1 = find234(timer_contexts,(void *)ptr[1],(cmpfn234)0x0);
    if (pvVar1 == (void *)0x0) {
      delpos234(timers,0);
    }
    else {
      if (now - (ptr[3] + -10) <= (ulong)(ptr[2] - (ptr[3] + -10))) {
        *next = ptr[2];
        goto LAB_0010662e;
      }
      delpos234(timers,0);
      (*(code *)*ptr)(ptr[1]);
    }
    safefree(ptr);
  } while( true );
}

Assistant:

bool run_timers(unsigned long anow, unsigned long *next)
{
    struct timer *first;

    init_timers();

    now = GETTICKCOUNT();

    while (1) {
        first = (struct timer *)index234(timers, 0);

        if (!first)
            return false;              /* no timers remaining */

        if (find234(timer_contexts, first->ctx, NULL) == NULL) {
            /*
             * This timer belongs to a context that has been
             * expired. Delete it without running.
             */
            delpos234(timers, 0);
            sfree(first);
        } else if (now - (first->when_set - 10) >
                   first->now - (first->when_set - 10)) {
            /*
             * This timer is active and has reached its running
             * time. Run it.
             */
            delpos234(timers, 0);
            first->fn(first->ctx, first->now);
            sfree(first);
        } else {
            /*
             * This is the first still-active timer that is in the
             * future. Return how long it has yet to go.
             */
            *next = first->now;
            return true;
        }
    }
}